

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yin.c
# Opt level: O2

void yin_write(yin_t *pe,int16 *frame)

{
  int32 *diff_window;
  ushort uVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  char cVar7;
  int iVar8;
  uint32 dshift;
  uint uVar9;
  ulong uVar10;
  int16 *piVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  
  bVar3 = pe->wstart + 1;
  iVar8 = 0;
  bVar5 = bVar3;
  if (bVar3 == pe->wsize) {
    bVar5 = 0;
  }
  pe->wstart = bVar5;
  uVar1 = pe->frame_size >> 1;
  diff_window = pe->diff_window[(ulong)bVar3 - 1];
  *diff_window = 0x8000;
  cVar7 = '\x10';
  while ((iVar8 != 0x20 && (((uint)uVar1 << ((byte)iVar8 & 0x1f) & 0x80000000) == 0))) {
    iVar8 = iVar8 + 1;
    cVar7 = cVar7 + -1;
  }
  bVar5 = (byte)iVar8 - 1;
  uVar10 = 1L << (bVar5 & 0x3f);
  piVar11 = frame + 1;
  uVar6 = 0;
  uVar14 = 0;
  for (uVar16 = 1; uVar16 < uVar1; uVar16 = uVar16 + 1) {
    uVar15 = 0;
    uVar9 = 0;
    for (uVar4 = 0; uVar12 = (uint)uVar15, uVar1 != uVar4; uVar4 = uVar4 + 1) {
      uVar9 = uVar9 + (uVar10 < uVar15);
      uVar15 = (ulong)((uVar12 >> (uVar10 < uVar15)) +
                      ((uint)(((int)frame[uVar4] - (int)piVar11[uVar4]) *
                             ((int)frame[uVar4] - (int)piVar11[uVar4])) >> ((byte)uVar9 & 0x1f)));
    }
    bVar2 = (char)uVar6 - (char)uVar9;
    uVar13 = uVar12 >> (bVar2 & 0x1f);
    if (uVar6 < uVar9) {
      uVar13 = uVar12 << (-bVar2 & 0x1f);
    }
    for (uVar13 = uVar13 + uVar14; uVar10 < uVar13; uVar13 = uVar13 >> 1) {
      uVar6 = uVar6 + 1;
    }
    uVar14 = uVar13 + (uVar13 == 0);
    diff_window[uVar16] =
         (int32)(((ulong)(uint)((int)uVar16 << (bVar5 & 0x1f)) / (ulong)uVar14) * uVar15 >>
                ((-(char)uVar9 - cVar7) + (char)uVar6 & 0x3fU));
    piVar11 = piVar11 + 1;
  }
  iVar8 = thresholded_search(diff_window,(uint)pe->search_threshold,0,(uint)uVar1);
  pe->period_window[(ulong)bVar3 - 1] = (uint16)iVar8;
  pe->nfr = pe->nfr + 1;
  return;
}

Assistant:

void
yin_write(yin_t *pe, int16 const *frame)
{
    int outptr, difflen;

    /* Rotate the window one frame forward. */
    ++pe->wstart;
    /* Fill in the frame before wstart. */
    outptr = pe->wstart - 1;
    /* Wrap around the window pointer. */
    if (pe->wstart == pe->wsize)
        pe->wstart = 0;

    /* Now calculate normalized difference function. */
    difflen = pe->frame_size / 2;
    cmn_diff(frame, pe->diff_window[outptr], difflen);

    /* Find the first point under threshold.  If not found, then
     * use the absolute minimum. */
    pe->period_window[outptr]
        = thresholded_search(pe->diff_window[outptr],
                             pe->search_threshold, 0, difflen);

    /* Increment total number of frames. */
    ++pe->nfr;
}